

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screena.cpp
# Opt level: O0

void plot_robot(int n)

{
  bool bVar1;
  int x;
  int y;
  int new_y;
  int new_x;
  int k;
  int i;
  int n_local;
  
  x = (int)(((long)((robots[n].x + 5) / 10) * (long)f_width) / 1000) + 2;
  y = (f_height - (int)(((long)((robots[n].y + 5) / 10) * (long)f_height) / 1000)) + 2;
  if ((robots[n].last_x != x) || (robots[n].last_y != y)) {
    bVar1 = true;
    for (new_x = 0; new_x < 4; new_x = new_x + 1) {
      if ((((new_x != n) && (robots[n].status != 0)) && (x == robots[new_x].last_x)) &&
         (y == robots[new_x].last_y)) {
        bVar1 = false;
        break;
      }
    }
    if (bVar1) {
      if (-1 < robots[n].last_y) {
        move(robots[n].last_y,robots[n].last_x);
        putchar(0x20);
      }
      move(y,x);
      putchar(n + 0x31);
      refresh();
      robots[n].last_x = x;
      robots[n].last_y = y;
    }
  }
  return;
}

Assistant:

void plot_robot(int n)
{
  int i, k;
   int new_x, new_y;

  new_x = (int) (((long)((robots[n].x+(CLICK/2)) / CLICK) * f_width) / MAX_X);
  new_y = (int) (((long)((robots[n].y+(CLICK/2)) / CLICK) * f_height) / MAX_Y);
  /* add one to x and y for playfield offset in screen, and inverse y */
  new_x += 2;;
  new_y = f_height - new_y;
  new_y +=2;

  if (robots[n].last_x != new_x || robots[n].last_y != new_y) {
    /* check for conflict */
    k = 1;
    for (i = 0; i < MAXROBOTS; i++) {
      if (i == n || robots[n].status == DEAD)
	continue; /* same robot as n or inactive */
      if (new_x == robots[i].last_x && new_y == robots[i].last_y) {
	k = 0;
	break;	  /* conflict, robot in that position */
      }
    }
    if (k) {
      if (robots[n].last_y >= 0) {
	move(robots[n].last_y,robots[n].last_x);
	addch(' ');
      }
      move(new_y,new_x);
      addch(n+'1');  /* ASCII dependent */
      refresh();
      robots[n].last_x = new_x;
      robots[n].last_y = new_y;
    }
  }
}